

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::BringWindowToDisplayBack(ImGuiWindow_conflict *window)

{
  ImGuiWindow_conflict **ppIVar1;
  ImGuiWindow_conflict **__src;
  int i;
  ImVector<ImGuiWindow_*>_conflict *this;
  size_t __n;
  
  this = &GImGui->Windows;
  i = 0;
  ppIVar1 = ImVector<ImGuiWindow_*>::operator[]((ImVector<ImGuiWindow_*> *)this,0);
  if (*ppIVar1 != window) {
    __n = 0;
    for (; i < this->Size; i = i + 1) {
      ppIVar1 = ImVector<ImGuiWindow_*>::operator[]((ImVector<ImGuiWindow_*> *)this,i);
      if (*ppIVar1 == window) {
        ppIVar1 = ImVector<ImGuiWindow_*>::operator[]((ImVector<ImGuiWindow_*> *)this,1);
        __src = ImVector<ImGuiWindow_*>::operator[]((ImVector<ImGuiWindow_*> *)this,0);
        memmove(ppIVar1,__src,__n);
        ppIVar1 = ImVector<ImGuiWindow_*>::operator[]((ImVector<ImGuiWindow_*> *)this,0);
        *ppIVar1 = window;
        return;
      }
      __n = __n + 8;
    }
  }
  return;
}

Assistant:

void ImGui::BringWindowToDisplayBack(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    if (g.Windows[0] == window)
        return;
    for (int i = 0; i < g.Windows.Size; i++)
        if (g.Windows[i] == window)
        {
            memmove(&g.Windows[1], &g.Windows[0], (size_t)i * sizeof(ImGuiWindow*));
            g.Windows[0] = window;
            break;
        }
}